

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  size_t sVar1;
  int iVar2;
  size_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  mbedtls_mpi *X_00;
  mbedtls_mpi *X_01;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  
  TA.s = 1;
  TA.n = 0;
  TA.p = (mbedtls_mpi_uint *)0x0;
  TB.s = 1;
  TB.n = 0;
  TB.p = (mbedtls_mpi_uint *)0x0;
  X_00 = A;
  if (X == A) {
    X_00 = &TA;
    iVar2 = mbedtls_mpi_copy(X_00,A);
    if (iVar2 != 0) goto LAB_0011b011;
  }
  X_01 = B;
  if (X == B) {
    X_01 = &TB;
    iVar2 = mbedtls_mpi_copy(X_01,B);
    if (iVar2 != 0) goto LAB_0011b011;
  }
  sVar1 = X_00->n;
  do {
    i = sVar1;
    if (i == 0) break;
    sVar1 = i - 1;
  } while (X_00->p[i - 1] == 0);
  lVar3 = X_01->n * 8;
  lVar5 = -X_01->n;
  while ((lVar3 = lVar3 + -8, lVar5 != 0 && (*(long *)((long)X_01->p + lVar3) == 0))) {
    lVar5 = lVar5 + 1;
  }
  iVar2 = mbedtls_mpi_grow(X,i - lVar5);
  if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_lset(X,0), iVar2 == 0)) {
    for (lVar4 = 0; -lVar4 != lVar5; lVar4 = lVar4 + 1) {
      mpi_mul_hlp(i,X_00->p,(mbedtls_mpi_uint *)((long)X->p + lVar3),
                  *(mbedtls_mpi_uint *)((long)X_01->p + lVar3));
      lVar3 = lVar3 + -8;
    }
    X->s = X_01->s * X_00->s;
    iVar2 = 0;
  }
LAB_0011b011:
  mbedtls_mpi_free(&TB);
  mbedtls_mpi_free(&TA);
  return iVar2;
}

Assistant:

int mbedtls_mpi_mul_mpi( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j;
    mbedtls_mpi TA, TB;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( B != NULL );

    mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TB );

    if( X == A ) { MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TA, A ) ); A = &TA; }
    if( X == B ) { MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) ); B = &TB; }

    for( i = A->n; i > 0; i-- )
        if( A->p[i - 1] != 0 )
            break;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( ; j > 0; j-- )
        mpi_mul_hlp( i, A->p, X->p + j - 1, B->p[j - 1] );

    X->s = A->s * B->s;

cleanup:

    mbedtls_mpi_free( &TB ); mbedtls_mpi_free( &TA );

    return( ret );
}